

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O2

bool __thiscall Clasp::Asp::LogicProgram::isFact(LogicProgram *this,PrgAtom *a)

{
  uint uVar1;
  uint uVar2;
  pointer pPVar3;
  Id_t IVar4;
  weight_t wVar5;
  long lVar6;
  bool bVar7;
  
  IVar4 = getRootId(this,*(uint *)&(a->super_PrgHead).super_PrgNode.field_0x4 & 0xfffffff);
  if (((this->atomState_).state_.ebo_.size <= IVar4) ||
     (bVar7 = true, ((this->atomState_).state_.ebo_.buf[IVar4] & 0x20) == 0)) {
    if (((ulong)(a->super_PrgHead).super_PrgNode & 0x3000000000000000) == 0x1000000000000000) {
      pPVar3 = (a->super_PrgHead).supports_.ebo_.buf;
      uVar1 = (a->super_PrgHead).supports_.ebo_.size;
      for (lVar6 = 0; bVar7 = (ulong)uVar1 << 2 != lVar6, bVar7; lVar6 = lVar6 + 4) {
        uVar2 = *(uint *)((long)&pPVar3->rep + lVar6);
        if (((uVar2 & 0xe) == 4) &&
           (wVar5 = PrgBody::bound((this->bodies_).ebo_.buf[uVar2 >> 4]), wVar5 == 0)) {
          return bVar7;
        }
      }
    }
    else {
      bVar7 = false;
    }
  }
  return bVar7;
}

Assistant:

bool LogicProgram::isFact(PrgAtom* a) const {
	uint32 eqId = getRootId(a->id());
	if (atomState_.isFact(eqId)) {
		return true;
	}
	if (a->value() == value_true) {
		for (PrgAtom::sup_iterator it = a->supps_begin(), end = a->supps_end(); it != end; ++it) {
			if (it->isBody() && it->isNormal() && getBody(it->node())->bound() == 0) {
				return true;
			}
		}
	}
	return false;
}